

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_NestingIsLimitedWithoutCrashing_Test::
~ParseErrorTest_NestingIsLimitedWithoutCrashing_Test
          (ParseErrorTest_NestingIsLimitedWithoutCrashing_Test *this)

{
  ParseErrorTest_NestingIsLimitedWithoutCrashing_Test *this_local;
  
  ~ParseErrorTest_NestingIsLimitedWithoutCrashing_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, NestingIsLimitedWithoutCrashing) {
  std::string start = "syntax = \"proto2\";\n";
  std::string end;

  const auto add = [&] {
    absl::StrAppend(&start, "message M {");
    absl::StrAppend(&end, "}");
  };
  const auto input = [&] { return absl::StrCat(start, end); };

  // The first ones work correctly.
  for (int i = 1; i < internal::cpp::MaxMessageDeclarationNestingDepth(); ++i) {
    add();
    const std::string str = input();
    SetupParser(str);
    FileDescriptorProto proto;
    proto.set_name("foo.proto");
    EXPECT_TRUE(parser_->Parse(input_.get(), &proto)) << input();
    EXPECT_EQ(io::Tokenizer::TYPE_END, input_->current().type);
    ASSERT_EQ("", error_collector_.text_);
    DescriptorPool pool;
    ASSERT_TRUE(pool.BuildFile(proto));
  }
  // The rest have parsing errors but they don't crash no matter how deep we
  // make them.
  const auto error = testing::HasSubstr(
      "Reached maximum recursion limit for nested messages.");
  add();
  ExpectHasErrors(input(), error);
  for (int i = 0; i < 100000; ++i) {
    add();
  }
  ExpectHasErrors(input(), error);
}